

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

point3 * __thiscall camera::defocus_disk_sample(point3 *__return_storage_ptr__,camera *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  
  do {
    iVar8 = rand();
    dVar7 = (double)iVar8 * 4.656612873077393e-10 + (double)iVar8 * 4.656612873077393e-10 + -1.0;
    iVar8 = rand();
    dVar5 = (double)iVar8 * 4.656612873077393e-10 + (double)iVar8 * 4.656612873077393e-10 + -1.0;
  } while (1.0 <= dVar7 * dVar7 + dVar5 * dVar5);
  dVar1 = (this->defocus_disk_u).e[2];
  dVar2 = (this->center).e[2];
  dVar3 = (this->defocus_disk_v).e[2];
  dVar6 = dVar5 * (this->defocus_disk_v).e[1] +
          (this->defocus_disk_u).e[1] * dVar7 + (this->center).e[1];
  auVar4._8_4_ = SUB84(dVar6,0);
  auVar4._0_8_ = dVar5 * (this->defocus_disk_v).e[0] +
                 (this->defocus_disk_u).e[0] * dVar7 + (this->center).e[0];
  auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
  *(undefined1 (*) [16])__return_storage_ptr__->e = auVar4;
  __return_storage_ptr__->e[2] = dVar3 * dVar5 + dVar1 * dVar7 + dVar2;
  return __return_storage_ptr__;
}

Assistant:

point3 defocus_disk_sample() const {
        // Returns a random point in the camera defocus disk.
        auto p = random_in_unit_disk();
        return center + (p[0] * defocus_disk_u) + (p[1] * defocus_disk_v);
    }